

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O2

void __thiscall SSD1306::OledI2C::OledI2C(OledI2C *this,string *device,uint8_t address)

{
  FileDescriptor *this_00;
  uchar *puVar1;
  int iVar2;
  long lVar3;
  system_error *psVar4;
  int *piVar5;
  error_category *peVar6;
  EVP_PKEY_CTX *ctx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string what;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  (this->super_OledHardware)._vptr_OledHardware = (_func_int **)&PTR__OledI2C_00108bc8;
  (this->super_OledPixel)._vptr_OledPixel = (_func_int **)&PTR__OledI2C_00108c58;
  this_00 = &this->fd_;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<bool_(int),_SSD1306::FileDescriptor::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.h:52:36)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(int),_SSD1306::FileDescriptor::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.h:52:36)>
             ::_M_manager;
  FileDescriptor::FileDescriptor(this_00,-1,(CloseIfFunction *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  memset(&this->blocks_,0,0x440);
  lVar3 = 0x59;
  do {
    puVar1 = (this->blocks_)._M_elems[0].bytes_._M_elems + lVar3 + -0x48;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    puVar1 = (this->blocks_)._M_elems[0].bytes_._M_elems + lVar3 + -0x58;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    (this->blocks_)._M_elems[0].bytes_._M_elems[lVar3 + -0x59] = '@';
    (this->blocks_)._M_elems[0].bytes_._M_elems[lVar3 + -0x38] = '\x01';
    lVar3 = lVar3 + 0x22;
  } while (lVar3 != 0x499);
  iVar2 = open((device->_M_dataplus)._M_p,2);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<bool_(int),_SSD1306::FileDescriptor::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.h:52:36)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(int),_SSD1306::FileDescriptor::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.h:52:36)>
             ::_M_manager;
  FileDescriptor::FileDescriptor((FileDescriptor *)&what,iVar2,(CloseIfFunction *)&local_78);
  FileDescriptor::operator=(this_00,(FileDescriptor *)&what);
  FileDescriptor::~FileDescriptor((FileDescriptor *)&what);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  if (this_00->fd_ != -1) {
    ctx = (EVP_PKEY_CTX *)0x703;
    iVar2 = ioctl(this_00->fd_,0x703,(ulong)address);
    if (iVar2 != -1) {
      init(this,ctx);
      return;
    }
    std::__cxx11::to_string(&local_120,0x80);
    std::operator+(&local_100,
                   "ioctl I2C_SLAVE /workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/OledI2C.cxx("
                   ,&local_120);
    std::operator+(&what,&local_100,")");
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    psVar4 = (system_error *)__cxa_allocate_exception(0x20);
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    peVar6 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(psVar4,iVar2,peVar6,&what);
    __cxa_throw(psVar4,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  std::operator+(&local_98,"open ",device);
  std::operator+(&local_120,&local_98,
                 " /workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/OledI2C.cxx("
                );
  std::__cxx11::to_string(&local_b8,0x78);
  std::operator+(&local_100,&local_120,&local_b8);
  std::operator+(&what,&local_100,")");
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_98);
  psVar4 = (system_error *)__cxa_allocate_exception(0x20);
  piVar5 = __errno_location();
  iVar2 = *piVar5;
  peVar6 = (error_category *)std::_V2::system_category();
  std::system_error::system_error(psVar4,iVar2,peVar6,&what);
  __cxa_throw(psVar4,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

SSD1306::OledI2C::OledI2C(
    const std::string& device,
    uint8_t address)
:
    fd_{-1},
    blocks_{}
{
    fd_ = FileDescriptor{::open(device.c_str(), O_RDWR)};

    if (fd_.fd() == -1)
    {
        std::string what( "open "
                        + device
                        + " " __FILE__ "("
                        + std::to_string(__LINE__)
                        + ")" );
        throw std::system_error(errno, std::system_category(), what);
    }

    if (ioctl(fd_.fd(), I2C_SLAVE, address) == -1)
    {
        std::string what( "ioctl I2C_SLAVE " __FILE__ "("
                        + std::to_string(__LINE__)
                        + ")" );
        throw std::system_error(errno, std::system_category(), what);
    }

    init();
}